

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clipper.cpp
# Opt level: O0

void __thiscall Clipper::DoRemoveClipRange(Clipper *this,angle_t start,angle_t end)

{
  ClipNode *pCVar1;
  bool bVar2;
  ClipNode *temp;
  ClipNode *node;
  angle_t end_local;
  angle_t start_local;
  Clipper *this_local;
  
  if (this->cliphead != (ClipNode *)0x0) {
    temp = this->cliphead;
    while( true ) {
      bVar2 = false;
      if (temp != (ClipNode *)0x0) {
        bVar2 = temp->start < end;
      }
      if (!bVar2) break;
      if ((temp->start < start) || (end < temp->end)) {
        temp = temp->next;
      }
      else {
        pCVar1 = temp->next;
        RemoveRange(this,temp);
        temp = pCVar1;
      }
    }
    for (temp = this->cliphead; temp != (ClipNode *)0x0; temp = temp->next) {
      if ((start <= temp->start) && (temp->start <= end)) {
        temp->start = end;
        return;
      }
      if ((temp->end < start) || (end < temp->end)) {
        if ((temp->start < start) && (end < temp->end)) {
          pCVar1 = ClipNode::NewRange(end,temp->end);
          temp->end = start;
          pCVar1->next = temp->next;
          pCVar1->prev = temp;
          temp->next = pCVar1;
          if (pCVar1->next == (ClipNode *)0x0) {
            return;
          }
          pCVar1->next->prev = pCVar1;
          return;
        }
      }
      else {
        temp->end = start;
      }
    }
  }
  return;
}

Assistant:

void Clipper::DoRemoveClipRange(angle_t start, angle_t end)
{
	ClipNode *node, *temp;

	if (cliphead)
	{
		//check to see if range contains any old ranges
		node = cliphead;
		while (node != NULL && node->start < end)
		{
			if (node->start >= start && node->end <= end)
			{
				temp = node;
				node = node->next;
				RemoveRange(temp);
			}
			else
			{
				node = node->next;
			}
		}
		
		//check to see if range overlaps a range (or possibly 2)
		node = cliphead;
		while (node != NULL)
		{
			if (node->start >= start && node->start <= end)
			{
				node->start = end;
				break;
			}
			else if (node->end >= start && node->end <= end)
			{
				node->end=start;
			}
			else if (node->start < start && node->end > end)
			{
				temp=ClipNode::NewRange(end, node->end);
				node->end=start;
				temp->next=node->next;
				temp->prev=node;
				node->next=temp;
				if (temp->next) temp->next->prev=temp;
				break;
			}
			node = node->next;
		}
	}
}